

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O3

void vocterm(voccxdef *ctx)

{
  if (ctx->voccxfus != (vocddef *)0x0) {
    free(ctx->voccxfus);
  }
  if (ctx->voccxdmn != (vocddef *)0x0) {
    free(ctx->voccxdmn);
  }
  if (ctx->voccxalm != (vocddef *)0x0) {
    free(ctx->voccxalm);
  }
  if (ctx->voc_stk_ptr != (uchar *)0x0) {
    free(ctx->voc_stk_ptr);
    return;
  }
  return;
}

Assistant:

void vocterm(voccxdef *ctx)
{
    /* delete the fuses, daemons, and notifiers */
    voctermfree(ctx->voccxfus);
    voctermfree(ctx->voccxdmn);
    voctermfree(ctx->voccxalm);

    /* delete the private stack */
    if (ctx->voc_stk_ptr != 0)
        mchfre(ctx->voc_stk_ptr);
}